

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

void bakeSWU2(word *W,ec_o *ec,octet *X,void *stack)

{
  void *state;
  u64 *in_RCX;
  long in_RSI;
  void *in_RDI;
  ec_o *unaff_retaddr;
  word *s;
  octet *H;
  undefined7 in_stack_ffffffffffffffc8;
  octet in_stack_ffffffffffffffcf;
  u64 *key;
  
  state = (void *)((long)in_RCX + *(long *)(*(long *)(in_RSI + 0x18) + 0x38) + 0x10);
  key = in_RCX;
  memSet(in_RCX,in_stack_ffffffffffffffcf,0x11b735);
  beltWBLStart(state,(octet *)key,(size_t)in_RCX);
  memCopy(in_RCX,(void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x11b772);
  beltWBLStepE(state,(size_t)key,in_RCX);
  u64From(in_RCX,(void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x11b7b2);
  zzMod(W,(word *)ec,(size_t)X,(word *)stack,(size_t)H,s);
  u64To(in_RCX,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),(u64 *)0x11b80d);
  (**(code **)(*(long *)(in_RSI + 0x18) + 0x40))(in_RCX,key,*(undefined8 *)(in_RSI + 0x18),state);
  ecpSWU((word *)H,s,unaff_retaddr,in_RDI);
  return;
}

Assistant:

static void bakeSWU2(word W[], const ec_o* ec, const octet X[], void* stack)
{
	octet* H;	/* [no + 16] */
	word* s;	/* [n + W_OF_O(16)] (совпадает с H) */
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(memIsValid(X, ec->f->no));
	ASSERT(wwIsValid(W, 2 * ec->f->n));
	// раскладка stack
	H = (octet*)stack;
	s = (word*)stack;
	stack = H + ec->f->no + 16;
	// H <- beltWBL(X, 0, 0)
	memSetZero(H + ec->f->no, 16);
	beltWBLStart(stack, H + ec->f->no, 16);
	memCopy(H, X, ec->f->no);
	beltWBLStepE(H, ec->f->no + 16, stack);
	// s <- \bar H mod p
	wwFrom(s, H, ec->f->no + 16);
	zzMod(s, s, ec->f->n + W_OF_O(16), ec->f->mod, ec->f->n, stack);
	// W <- ecpSWU(s)
	wwTo(H, ec->f->no, s);
	qrFrom(s, H, ec->f, stack);
	ecpSWU(W, s, ec, stack);
}